

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_A_CallSpecial
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  VMValue *pVVar1;
  bool bVar2;
  int arg3;
  int iVar3;
  char *pcVar4;
  int arg2;
  int arg4;
  int iVar5;
  AActor *activator;
  
  if (numparam < 1) {
    pcVar4 = "(paramnum) < numparam";
    goto LAB_003db64f;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003db63f:
    pcVar4 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003db64f:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x595,
                  "int AF_AActor_A_CallSpecial(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  activator = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (activator == (AActor *)0x0) goto LAB_003db4f0;
    bVar2 = DObject::IsKindOf((DObject *)activator,AActor::RegistrationInfo.MyClass);
    if (!bVar2) {
      pcVar4 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003db64f;
    }
  }
  else {
    if (activator != (AActor *)0x0) goto LAB_003db63f;
LAB_003db4f0:
    activator = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar4 = "(paramnum) < numparam";
LAB_003db677:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x596,
                  "int AF_AActor_A_CallSpecial(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  if (param[1].field_0.field_3.Type != '\0') {
    pcVar4 = "param[paramnum].Type == REGT_INT";
    goto LAB_003db677;
  }
  pVVar1 = param + 1;
  if ((uint)numparam < 3) {
    param = defaultparam->Array;
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar4 = "(defaultparam[paramnum]).Type == REGT_INT";
      goto LAB_003db724;
    }
    iVar3 = param[2].field_0.i;
LAB_003db544:
    if (param[3].field_0.field_3.Type != '\0') {
      pcVar4 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003db743:
      __assert_fail(pcVar4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x598,
                    "int AF_AActor_A_CallSpecial(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    arg2 = param[3].field_0.i;
LAB_003db553:
    if (param[4].field_0.field_3.Type != '\0') {
      pcVar4 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003db6d4:
      __assert_fail(pcVar4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x599,
                    "int AF_AActor_A_CallSpecial(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    arg3 = param[4].field_0.i;
LAB_003db562:
    if (param[5].field_0.field_3.Type != '\0') {
      pcVar4 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003db6b5:
      __assert_fail(pcVar4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x59a,
                    "int AF_AActor_A_CallSpecial(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    arg4 = param[5].field_0.i;
  }
  else {
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar4 = "(param[paramnum]).Type == REGT_INT";
LAB_003db724:
      __assert_fail(pcVar4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x597,
                    "int AF_AActor_A_CallSpecial(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar3 = param[2].field_0.i;
    if (numparam == 3) {
      param = defaultparam->Array;
      goto LAB_003db544;
    }
    if (param[3].field_0.field_3.Type != '\0') {
      pcVar4 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003db743;
    }
    arg2 = param[3].field_0.i;
    if ((uint)numparam < 5) {
      param = defaultparam->Array;
      goto LAB_003db553;
    }
    if (param[4].field_0.field_3.Type != '\0') {
      pcVar4 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003db6d4;
    }
    arg3 = param[4].field_0.i;
    if (numparam == 5) {
      param = defaultparam->Array;
      goto LAB_003db562;
    }
    if (param[5].field_0.field_3.Type != '\0') {
      pcVar4 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003db6b5;
    }
    arg4 = param[5].field_0.i;
    if (6 < (uint)numparam) {
      if (param[6].field_0.field_3.Type != '\0') {
        pcVar4 = "(param[paramnum]).Type == REGT_INT";
        goto LAB_003db696;
      }
      goto LAB_003db57c;
    }
    param = defaultparam->Array;
  }
  if (param[6].field_0.field_3.Type != '\0') {
    pcVar4 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003db696:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x59b,
                  "int AF_AActor_A_CallSpecial(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
LAB_003db57c:
  iVar5 = 0;
  iVar3 = P_ExecuteSpecial((pVVar1->field_0).i,(line_t *)0x0,activator,false,iVar3,arg2,arg3,arg4,
                           param[6].field_0.i);
  if (0 < numret) {
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x59f,
                    "int AF_AActor_A_CallSpecial(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    VMReturn::SetInt(ret,(uint)(iVar3 != 0));
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_CallSpecial)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT		(special);
	PARAM_INT_DEF	(arg1);
	PARAM_INT_DEF	(arg2);
	PARAM_INT_DEF	(arg3);
	PARAM_INT_DEF	(arg4);
	PARAM_INT_DEF	(arg5);

	bool res = !!P_ExecuteSpecial(special, NULL, self, false, arg1, arg2, arg3, arg4, arg5);

	ACTION_RETURN_BOOL(res);
}